

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  int iVar1;
  string *name;
  long lVar2;
  char nMatches [2];
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  cmStateSnapshot *local_38;
  
  local_38 = &this->StateSnapshot;
  lVar2 = -10;
  name = matchVariables_abi_cxx11_;
  iVar1 = 0;
  do {
    local_58 = &local_48;
    if (re->endp[lVar2] == (char *)0x0) {
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,re->endp[lVar2],re->endp[lVar2 + 10]);
    }
    if (local_50 != 0) {
      AddDefinition(this,name,local_58);
      cmStateSnapshot::GetDefinition(local_38,name);
      iVar1 = (int)lVar2 + 0x3a;
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    name = name + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  local_58._0_2_ = (ushort)(byte)iVar1;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,(char *)&local_58);
  cmStateSnapshot::GetDefinition(local_38,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m.c_str());
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}